

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CompositedBupOutputter.cpp
# Opt level: O2

unique_ptr<BupOutputter,_std::default_delete<BupOutputter>_> BupOutputter::makeComposited(void)

{
  undefined8 in_RAX;
  __uniq_ptr_data<BupOutputter,_std::default_delete<BupOutputter>,_true,_true> in_RDI;
  
  std::make_unique<MTCompositedBupOutputter>();
  *(undefined8 *)
   in_RDI.super___uniq_ptr_impl<BupOutputter,_std::default_delete<BupOutputter>_>._M_t.
   super__Tuple_impl<0UL,_BupOutputter_*,_std::default_delete<BupOutputter>_>.
   super__Head_base<0UL,_BupOutputter_*,_false>._M_head_impl = in_RAX;
  return (__uniq_ptr_data<BupOutputter,_std::default_delete<BupOutputter>,_true,_true>)
         (tuple<BupOutputter_*,_std::default_delete<BupOutputter>_>)
         in_RDI.super___uniq_ptr_impl<BupOutputter,_std::default_delete<BupOutputter>_>._M_t.
         super__Tuple_impl<0UL,_BupOutputter_*,_std::default_delete<BupOutputter>_>.
         super__Head_base<0UL,_BupOutputter_*,_false>._M_head_impl;
}

Assistant:

std::unique_ptr<BupOutputter> BupOutputter::makeComposited() {
#if ENABLE_MULTITHREADED
	return std::make_unique<MTCompositedBupOutputter>();
#else
	return std::make_unique<CompositedBupOutputter>();
#endif
}